

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_byte_string(basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *this,byte_string_view *b,semantic_tag tag,ser_context *context,error_code *ec)

{
  bool bVar1;
  undefined8 uVar2;
  const_iterator puVar3;
  char in_DL;
  byte_string_view *in_RSI;
  error_code *in_stack_00000040;
  ser_context *in_stack_00000048;
  semantic_tag in_stack_00000057;
  string_view_type *in_stack_00000058;
  basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  byte_string_chars_format format;
  byte_string_chars_format encoding_hint;
  string *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte_string_chars_format bVar4;
  undefined1 in_stack_ffffffffffffff37;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_80 [33];
  byte_string_chars_format local_5f;
  byte_string_chars_format local_5e;
  undefined1 local_5d;
  char local_11;
  byte_string_view *local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  bVar1 = std::
          vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
                   *)CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  if (!bVar1) {
    if (local_11 == '\b') {
      local_5e = base16;
    }
    else if (local_11 == '\t') {
      local_5e = base64;
    }
    else if (local_11 == '\f') {
      local_5e = base64url;
    }
    else {
      local_5e = none;
    }
    local_5f = jsoncons::detail::resolve_byte_string_chars_format(local_5e,none,base64url);
    std::__cxx11::string::string(local_80);
    if (local_5f == base16) {
      bVar4 = local_5f;
      puVar3 = byte_string_view::begin(local_10);
      byte_string_view::end(local_10);
      encode_base16<unsigned_char_const*,std::__cxx11::string>
                ((uchar *)CONCAT17(local_11,CONCAT16(bVar4,in_stack_ffffffffffffff30)),puVar3,
                 in_stack_ffffffffffffff20);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
      visit_string(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000048,
                   in_stack_00000040);
    }
    else if (local_5f == base64) {
      puVar3 = byte_string_view::begin(local_10);
      byte_string_view::end(local_10);
      encode_base64<unsigned_char_const*,std::__cxx11::string>
                (puVar3,(uchar *)in_stack_ffffffffffffff18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4310c3);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
      visit_string(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000048,
                   in_stack_00000040);
    }
    else {
      puVar3 = byte_string_view::begin(local_10);
      byte_string_view::end(local_10);
      encode_base64url<unsigned_char_const*,std::__cxx11::string>
                ((uchar *)in_stack_ffffffffffffff20,puVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x43112d);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
      visit_string(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000048,
                   in_stack_00000040);
    }
    std::__cxx11::string::~string(local_80);
    return true;
  }
  local_5d = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  assertion_error::assertion_error
            ((assertion_error *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_5d = 0;
  __cxa_throw(uVar2,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                              semantic_tag tag, 
                              const ser_context& context,
                              std::error_code& ec) override
    {
        JSONCONS_ASSERT(!stack_.empty());

        byte_string_chars_format encoding_hint;
        switch (tag)
        {
            case semantic_tag::base16:
                encoding_hint = byte_string_chars_format::base16;
                break;
            case semantic_tag::base64:
                encoding_hint = byte_string_chars_format::base64;
                break;
            case semantic_tag::base64url:
                encoding_hint = byte_string_chars_format::base64url;
                break;
            default:
                encoding_hint = byte_string_chars_format::none;
                break;
        }
        byte_string_chars_format format = jsoncons::detail::resolve_byte_string_chars_format(encoding_hint,byte_string_chars_format::none,byte_string_chars_format::base64url);

        std::basic_string<CharT> s;
        switch (format)
        {
            case byte_string_chars_format::base16:
            {
                encode_base16(b.begin(),b.end(),s);
                visit_string(s, semantic_tag::none, context, ec);
                break;
            }
            case byte_string_chars_format::base64:
            {
                encode_base64(b.begin(),b.end(),s);
                visit_string(s, semantic_tag::none, context, ec);
                break;
            }
            case byte_string_chars_format::base64url:
            {
                encode_base64url(b.begin(),b.end(),s);
                visit_string(s, semantic_tag::none, context, ec);
                break;
            }
            default:
            {
                JSONCONS_UNREACHABLE();
            }
        }

        JSONCONS_VISITOR_RETURN;
    }